

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall moira::Moira::dump16(Moira *this,char *str,u16 *values,int cnt)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  char *pcVar4;
  int iVar5;
  ulong uVar6;
  StrWriter writer;
  StrWriter local_70;
  
  local_70.style = &this->dataStyle;
  local_70.tab.raw = 8;
  local_70.comment[0] = '\0';
  if (0 < cnt) {
    uVar6 = 0;
    local_70.base = str;
    local_70.ptr = str;
    do {
      if ((uVar6 != 0) && (0 < (this->dataStyle).tab)) {
        iVar5 = 1;
        do {
          pcVar1 = local_70.ptr + 1;
          *local_70.ptr = ' ';
          local_70.ptr = pcVar1;
          if (uVar6 == 0) break;
          bVar3 = iVar5 < (this->dataStyle).tab;
          iVar5 = iVar5 + 1;
        } while (bVar3);
      }
      StrWriter::operator<<(&local_70,(UInt16)values[uVar6]);
      cVar2 = local_70.comment[0];
      pcVar4 = local_70.ptr;
      pcVar1 = local_70.comment;
      while (pcVar1 = pcVar1 + 1, cVar2 != '\0') {
        local_70.ptr = pcVar4 + 1;
        *pcVar4 = cVar2;
        pcVar4 = local_70.ptr;
        cVar2 = *pcVar1;
      }
      *pcVar4 = '\0';
      uVar6 = uVar6 + 1;
      local_70.ptr = pcVar4;
    } while (uVar6 != (uint)cnt);
  }
  return;
}

Assistant:

void
Moira::dump16(char *str, u16 values[], int cnt) const
{
    StrWriter writer(str, dataStyle);

    for (int i = 0; i < cnt; i++) {

        for (int j = 0; i && j < dataStyle.tab; j++) writer << ' ';
        writer << UInt16{values[i]} << Finish{};
    }
}